

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void kj::(anonymous_namespace)::expectRes<kj::Array<unsigned_char>,4ul>
               (EncodingResult<kj::Array<unsigned_char>_> *result,byte (*expected) [4],bool errors)

{
  EncodingResult<kj::Array<unsigned_char>_> *pEVar1;
  undefined1 in_R8B;
  ArrayPtr<const_unsigned_char> AVar2;
  ArrayPtr<const_unsigned_char> expected_00;
  EncodingResult<kj::Array<unsigned_char>_> local_40;
  byte local_19;
  byte (*pabStack_18) [4];
  bool errors_local;
  byte (*expected_local) [4];
  EncodingResult<kj::Array<unsigned_char>_> *result_local;
  
  local_19 = errors;
  pabStack_18 = expected;
  expected_local = (byte (*) [4])result;
  pEVar1 = mv<kj::EncodingResult<kj::Array<unsigned_char>>>(result);
  EncodingResult<kj::Array<unsigned_char>_>::EncodingResult(&local_40,pEVar1);
  AVar2 = arrayPtr<unsigned_char_const>(*pabStack_18,4);
  expected_00.ptr = AVar2.size_;
  expected_00.size_._0_4_ = local_19 & 1;
  expected_00.size_._4_4_ = 0;
  expectResImpl<kj::Array<unsigned_char>,unsigned_char>
            ((_anonymous_namespace_ *)&local_40,
             (EncodingResult<kj::Array<unsigned_char>_> *)AVar2.ptr,expected_00,(bool)in_R8B);
  EncodingResult<kj::Array<unsigned_char>_>::~EncodingResult(&local_40);
  return;
}

Assistant:

void expectRes(EncodingResult<T> result,
               byte (&expected)[s],
               bool errors = false) {
  expectResImpl(kj::mv(result), arrayPtr<const byte>(expected, s), errors);
}